

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::Texture2DGenMipmapCase::iterate(Texture2DGenMipmapCase *this)

{
  pointer *this_00;
  code *pcVar1;
  RenderContext *context;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  qpTestResult testResult;
  undefined4 extraout_var;
  Texture2D *pTVar7;
  PixelBufferAccess *pPVar8;
  undefined4 extraout_var_00;
  char *str;
  reference texCoord_00;
  undefined4 extraout_var_01;
  PixelFormat *pPVar9;
  undefined4 extraout_var_02;
  TestLog *log;
  char *local_2b8;
  char *local_2b0;
  int iStack_1c8;
  qpTestResult compareResult;
  int local_1c0;
  tcu local_1bc [8];
  float afStack_1b4 [2];
  float local_1ac;
  undefined1 local_1a8 [8];
  GenMipmapPrecision comparePrec;
  undefined1 local_174 [8];
  IVec4 cmpBits;
  Vector<bool,_4> local_154;
  TextureFormat TStack_150;
  BVec4 formatMask;
  undefined1 local_148 [8];
  IVec4 formatBits;
  Vector<int,_4> local_128;
  Vector<int,_4> local_118;
  undefined1 local_108 [8];
  IVec4 framebufferBits;
  RandomViewport viewport;
  int levelHeight;
  int levelWidth;
  int levelNdx;
  Vector<float,_2> local_d4;
  Vector<float,_4> local_cc;
  Vector<float,_4> local_bc;
  undefined1 local_a0 [8];
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_80 [8];
  Texture2D resultTexture;
  int numLevels;
  deUint32 wrapT;
  deUint32 wrapS;
  deUint32 magFilter;
  deUint32 minFilter;
  Functions *gl;
  Texture2DGenMipmapCase *this_local;
  long lVar6;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  iVar2 = de::max<int>(this->m_width,this->m_height);
  iVar2 = ::deLog2Floor32(iVar2);
  resultTexture.m_view.m_levels._4_4_ = iVar2 + 1;
  this_00 = &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  tcu::TextureFormat::TextureFormat((TextureFormat *)this_00,RGBA,UNORM_INT8);
  pTVar7 = glu::Texture2D::getRefTexture(this->m_texture);
  iVar2 = tcu::Texture2D::getWidth(pTVar7);
  pTVar7 = glu::Texture2D::getRefTexture(this->m_texture);
  iVar3 = tcu::Texture2D::getHeight(pTVar7);
  tcu::Texture2D::Texture2D((Texture2D *)local_80,(TextureFormat *)this_00,iVar2,iVar3);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a0);
  pTVar7 = glu::Texture2D::getRefTexture(this->m_texture);
  tcu::Texture2D::allocLevel(pTVar7,0);
  pTVar7 = glu::Texture2D::getRefTexture(this->m_texture);
  pPVar8 = tcu::TextureLevelPyramid::getLevel(&pTVar7->super_TextureLevelPyramid,0);
  tcu::Vector<float,_4>::Vector(&local_bc,1.0,0.5,0.0,0.5);
  tcu::Vector<float,_4>::Vector(&local_cc,0.0,0.0,1.0,1.0);
  tcu::fillWithGrid(pPVar8,8,&local_bc,&local_cc);
  (*this->m_texture->_vptr_Texture2D[2])();
  pcVar1 = *(code **)(lVar6 + 0xb8);
  dVar4 = glu::Texture2D::getGLTexture(this->m_texture);
  (*pcVar1)(0xde1,dVar4);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2700);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2600);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x345);
  (**(code **)(lVar6 + 0xc18))(0x8192,this->m_hint);
  (**(code **)(lVar6 + 0x710))(0xde1);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGenerateMipmap()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x34a);
  tcu::Vector<float,_2>::Vector(&local_d4,0.0,0.0);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&levelWidth,1.0,1.0);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)local_a0,&local_d4,(Vec2 *)&levelWidth);
  for (levelHeight = 0; levelHeight < resultTexture.m_view.m_levels._4_4_;
      levelHeight = levelHeight + 1) {
    iVar2 = de::max<int>(1,this->m_width >> ((byte)levelHeight & 0x1f));
    iVar3 = de::max<int>(1,this->m_height >> ((byte)levelHeight & 0x1f));
    iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    str = tcu::TestNode::getName((TestNode *)this);
    dVar4 = deStringHash(str);
    deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
              ((RandomViewport *)(framebufferBits.m_data + 2),
               (RenderTarget *)CONCAT44(extraout_var_00,iVar5),iVar2,iVar3,dVar4 + levelHeight);
    (**(code **)(lVar6 + 0x1a00))
              (framebufferBits.m_data[2],framebufferBits.m_data[3],viewport.x,viewport.y);
    texCoord_00 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_a0,0);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,texCoord_00,TEXTURETYPE_2D);
    tcu::Texture2D::allocLevel((Texture2D *)local_80,levelHeight);
    iVar3 = framebufferBits.m_data[3];
    iVar2 = framebufferBits.m_data[2];
    context = this->m_renderCtx;
    pPVar8 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_80,levelHeight);
    glu::readPixels(context,iVar2,iVar3,pPVar8);
  }
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar9 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar2));
  glu::TextureTestUtil::getBitsVec((TextureTestUtil *)&local_128,pPVar9);
  tcu::operator-((tcu *)&local_118,&local_128,2);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(formatBits.m_data + 2),0);
  tcu::max<int,4>((tcu *)local_108,&local_118,(Vector<int,_4> *)(formatBits.m_data + 2));
  TStack_150 = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::getTextureFormatBitDepth((tcu *)local_148,&stack0xfffffffffffffeb0);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(cmpBits.m_data + 2),0);
  tcu::greaterThan<int,4>
            ((tcu *)&local_154,(Vector<int,_4> *)local_148,(Vector<int,_4> *)(cmpBits.m_data + 2));
  tcu::min<int,4>((tcu *)&comparePrec.colorMask,(Vector<int,_4> *)local_108,
                  (Vector<int,_4> *)local_148);
  tcu::select<int,4>((tcu *)local_174,(Vector<int,_4> *)&comparePrec.colorMask,
                     (Vector<int,_4> *)local_108,&local_154);
  glu::TextureTestUtil::GenMipmapPrecision::GenMipmapPrecision((GenMipmapPrecision *)local_1a8);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar9 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar2));
  glu::TextureTestUtil::getCompareMask((TextureTestUtil *)&local_1ac,pPVar9);
  comparePrec.colorThreshold.m_data[2] = local_1ac;
  tcu::computeFixedPointThreshold(local_1bc,(IVec4 *)local_174);
  comparePrec.filterBits.m_data._4_8_ = local_1bc;
  comparePrec.colorThreshold.m_data[0] = afStack_1b4[0];
  comparePrec.colorThreshold.m_data[1] = afStack_1b4[1];
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&stack0xfffffffffffffe38,4,4,0);
  comparePrec.filterBits.m_data[0] = local_1c0;
  local_1a8._0_4_ = iStack_1c8;
  local_1a8._4_4_ = compareResult;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  pTVar7 = glu::Texture2D::getRefTexture(this->m_texture);
  testResult = glu::TextureTestUtil::compareGenMipmapResult
                         (log,(Texture2D *)local_80,pTVar7,(GenMipmapPrecision *)local_1a8);
  if (testResult == QP_TEST_RESULT_PASS) {
    local_2b0 = "Pass";
  }
  else {
    if (testResult == QP_TEST_RESULT_QUALITY_WARNING) {
      local_2b8 = "Low-quality method used";
    }
    else {
      local_2b8 = "";
      if (testResult == QP_TEST_RESULT_FAIL) {
        local_2b8 = "Image comparison failed";
      }
    }
    local_2b0 = local_2b8;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,testResult,local_2b0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_a0);
  tcu::Texture2D::~Texture2D((Texture2D *)local_80);
  return STOP;
}

Assistant:

Texture2DGenMipmapCase::IterateResult Texture2DGenMipmapCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();

	const deUint32			minFilter			= GL_NEAREST_MIPMAP_NEAREST;
	const deUint32			magFilter			= GL_NEAREST;
	const deUint32			wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32			wrapT				= GL_CLAMP_TO_EDGE;

	const int				numLevels			= deLog2Floor32(de::max(m_width, m_height))+1;

	tcu::Texture2D			resultTexture		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), m_texture->getRefTexture().getWidth(), m_texture->getRefTexture().getHeight());

	vector<float>			texCoord;

	// Initialize texture level 0 with colored grid.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 8, tcu::Vec4(1.0f, 0.5f, 0.0f, 0.5f), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	// Upload data and setup params.
	m_texture->upload();

	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Generate mipmap.
	gl.hint(GL_GENERATE_MIPMAP_HINT, m_hint);
	gl.generateMipmap(GL_TEXTURE_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap()");

	// Use (0, 0) -> (1, 1) texture coordinates.
	computeQuadTexCoord2D(texCoord, Vec2(0.0f, 0.0f), Vec2(1.0f, 1.0f));

	// Fetch resulting texture by rendering.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const int				levelWidth		= de::max(1, m_width >> levelNdx);
		const int				levelHeight		= de::max(1, m_height >> levelNdx);
		const RandomViewport	viewport		(m_renderCtx.getRenderTarget(), levelWidth, levelHeight, deStringHash(getName()) + levelNdx);

		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
		m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_2D);

		resultTexture.allocLevel(levelNdx);
		glu::readPixels(m_renderCtx, viewport.x, viewport.y, resultTexture.getLevel(levelNdx));
	}

	// Compare results
	{

		const IVec4			framebufferBits		= max(getBitsVec(m_renderCtx.getRenderTarget().getPixelFormat())-2, IVec4(0));
		const IVec4			formatBits			= tcu::getTextureFormatBitDepth(glu::mapGLTransferFormat(m_format, m_dataType));
		const tcu::BVec4	formatMask			= greaterThan(formatBits, IVec4(0));
		const IVec4			cmpBits				= select(min(framebufferBits, formatBits), framebufferBits, formatMask);
		GenMipmapPrecision	comparePrec;

		comparePrec.colorMask		= getCompareMask(m_renderCtx.getRenderTarget().getPixelFormat());
		comparePrec.colorThreshold	= tcu::computeFixedPointThreshold(cmpBits);
		comparePrec.filterBits		= tcu::IVec3(4, 4, 0);

		const qpTestResult compareResult = compareGenMipmapResult(m_testCtx.getLog(), resultTexture, m_texture->getRefTexture(), comparePrec);

		m_testCtx.setTestResult(compareResult, compareResult == QP_TEST_RESULT_PASS				? "Pass" :
											   compareResult == QP_TEST_RESULT_QUALITY_WARNING	? "Low-quality method used"	:
											   compareResult == QP_TEST_RESULT_FAIL				? "Image comparison failed"	: "");
	}

	return STOP;
}